

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O1

void __thiscall
nuraft::asio_rpc_client::send_retry
          (asio_rpc_client *this,ptr<asio_rpc_client> *self,ptr<asio::steady_timer> *timer,
          ptr<req_msg> *req,rpc_handler *when_done,uint64_t send_timeout_ms,error_code *err)

{
  element_type *peVar1;
  int iVar2;
  char *pcVar3;
  ptr<rpc_exception> except;
  ptr<resp_msg> rsp;
  undefined1 local_129;
  shared_ptr<nuraft::rpc_exception> local_128;
  shared_ptr<nuraft::resp_msg> local_118;
  string *local_100;
  string local_f8 [6];
  char *local_30;
  
  if ((err->_M_value == 0) && ((this->num_send_fails_).super___atomic_base<unsigned_long>._M_i < 6))
  {
    (*(this->super_rpc_client)._vptr_rpc_client[2])(this,req,when_done,send_timeout_ms);
    return;
  }
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (err->_M_value == 0) {
    if (peVar1 == (element_type *)0x0) goto LAB_00198cbc;
    iVar2 = (*peVar1->_vptr_logger[7])();
    if (iVar2 < 2) goto LAB_00198cbc;
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pcVar3 = "disabled";
    if (this->ssl_enabled_ != false) {
      pcVar3 = "enabled";
    }
    msg_if_given_abi_cxx11_
              (local_f8,"connection to %s:%s timeout (SSL %s)",(this->host_)._M_dataplus._M_p,
               (this->port_)._M_dataplus._M_p,pcVar3);
    (*peVar1->_vptr_logger[8])
              (peVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
               ,"send_retry",0x3d2,local_f8);
  }
  else {
    if (peVar1 == (element_type *)0x0) goto LAB_00198cbc;
    iVar2 = (*peVar1->_vptr_logger[7])();
    if (iVar2 < 2) goto LAB_00198cbc;
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              (local_f8,"error happened during async wait: %d",(ulong)(uint)err->_M_value);
    (*peVar1->_vptr_logger[8])
              (peVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
               ,"send_retry",0x3ce,local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8[0]._M_dataplus._M_p != &local_f8[0].field_2) {
    operator_delete(local_f8[0]._M_dataplus._M_p);
  }
LAB_00198cbc:
  LOCK();
  (this->abandoned_)._M_base._M_i = true;
  UNLOCK();
  local_118.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_118.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_30 = "timeout while connecting to %s";
  snprintf((char *)local_f8,200,"timeout while connecting to %s",(this->host_)._M_dataplus._M_p);
  local_128.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_100 = local_f8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nuraft::rpc_exception,std::allocator<nuraft::rpc_exception>,char_const*,std::shared_ptr<nuraft::req_msg>&>
            (&local_128.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(rpc_exception **)&local_128,
             (allocator<nuraft::rpc_exception> *)&local_129,(char **)&local_100,req);
  if ((when_done->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*when_done->_M_invoker)((_Any_data *)when_done,&local_118,&local_128);
    if (local_128.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_128.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_118.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_118.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void send_retry( ptr<asio_rpc_client> self,
                     ptr<asio::steady_timer> timer,
                     ptr<req_msg>& req,
                     rpc_handler& when_done,
                     uint64_t send_timeout_ms,
                     const ERROR_CODE& err )
    {
        if ( err || num_send_fails_ >= SEND_RETRY_MAX ) {
            if (err) {
                p_er("error happened during async wait: %d", err.value());
            } else {
                p_er( "connection to %s:%s timeout (SSL %s)",
                      host_.c_str(), port_.c_str(),
                      ( ssl_enabled_ ? "enabled" : "disabled" ) );
            }
            abandoned_= true;
            ptr<resp_msg> rsp;
            ptr<rpc_exception> except
               ( cs_new<rpc_exception>
                       ( lstrfmt("timeout while connecting to %s")
                                .fmt(host_.c_str()),
                         req ) );
            when_done(rsp, except);
            return;
        }
        send(req, when_done, send_timeout_ms);
    }